

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::GetImplibGNUtoMS
          (cmGeneratorTarget *this,string *gnuName,string *out,char *newExt)

{
  string *psVar1;
  bool bVar2;
  ulong uVar3;
  char *local_b8;
  bool local_89;
  string local_88 [55];
  byte local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  char *local_30;
  char *newExt_local;
  string *out_local;
  string *gnuName_local;
  cmGeneratorTarget *this_local;
  
  local_30 = newExt;
  newExt_local = (char *)out;
  out_local = gnuName;
  gnuName_local = (string *)this;
  bVar2 = HasImplibGNUtoMS(this);
  local_51 = 0;
  local_89 = false;
  if (bVar2) {
    uVar3 = std::__cxx11::string::size();
    psVar1 = out_local;
    local_89 = false;
    if (6 < uVar3) {
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)&local_50,(ulong)psVar1);
      local_51 = 1;
      local_89 = std::operator==(&local_50,".dll.a");
    }
  }
  if ((local_51 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  psVar1 = out_local;
  if (local_89 == false) {
    this_local._7_1_ = false;
  }
  else {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_88,(ulong)psVar1);
    std::__cxx11::string::operator=((string *)newExt_local,local_88);
    std::__cxx11::string::~string(local_88);
    if (local_30 == (char *)0x0) {
      local_b8 = ".lib";
    }
    else {
      local_b8 = local_30;
    }
    std::__cxx11::string::operator+=((string *)newExt_local,local_b8);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmGeneratorTarget::GetImplibGNUtoMS(std::string const& gnuName,
                                std::string& out, const char* newExt) const
{
  if(this->HasImplibGNUtoMS() &&
     gnuName.size() > 6 && gnuName.substr(gnuName.size()-6) == ".dll.a")
    {
    out = gnuName.substr(0, gnuName.size()-6);
    out += newExt? newExt : ".lib";
    return true;
    }
  return false;
}